

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QSynth.cpp
# Opt level: O2

uint __thiscall
RealtimeHelper::getPlayingNotes(RealtimeHelper *this,uint partNumber,Bit8u *keys,Bit8u *velocities)

{
  uint uVar1;
  QMutexLocker<QMutex> local_40;
  
  local_40.m = &this->stateSnapshotMutex;
  QBasicMutex::lock(&(local_40.m)->super_QBasicMutex);
  local_40.isLocked = true;
  uVar1 = 0;
  if (this->qsynth->state == SynthState_OPEN) {
    uVar1 = (this->stateSnapshot).partStates[partNumber].playingNotesCount;
    memcpy(keys,(this->stateSnapshot).partStates[partNumber].keysOfPlayingNotes,(ulong)uVar1);
    memcpy(velocities,(this->stateSnapshot).partStates[partNumber].velocitiesOfPlayingNotes,
           (ulong)uVar1);
  }
  QMutexLocker<QMutex>::unlock(&local_40);
  return uVar1;
}

Assistant:

uint getPlayingNotes(uint partNumber, Bit8u *keys, Bit8u *velocities) {
		QMutexLocker stateSnapshotLocker(&stateSnapshotMutex);
		if (!qsynth.isOpen()) return 0;
		Bit32u playingNotesCount = stateSnapshot.partStates[partNumber].playingNotesCount;
		memcpy(keys, stateSnapshot.partStates[partNumber].keysOfPlayingNotes, playingNotesCount * sizeof(Bit8u));
		memcpy(velocities, stateSnapshot.partStates[partNumber].velocitiesOfPlayingNotes, playingNotesCount * sizeof(Bit8u));
		return playingNotesCount;
	}